

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O1

void __thiscall Heap::sort_up(Heap *this,GridNode *item)

{
  int iVar1;
  int iVar2;
  GridNode *pGVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  iVar1 = item->hCost;
  iVar5 = (item->index - (item->index + -1 >> 0x1f)) + -1 >> 1;
  iVar2 = this->maxCount;
  iVar7 = 0;
  if (0 < iVar5) {
    iVar7 = iVar5;
  }
  if (iVar2 <= iVar5) {
    iVar7 = iVar2 + -1;
  }
  iVar5 = item->gCost;
  do {
    pGVar3 = this->list[iVar7];
    iVar6 = (pGVar3->gCost + pGVar3->hCost) - (iVar5 + iVar1);
    if (iVar6 == 0) {
      iVar6 = pGVar3->hCost - iVar1;
    }
    if (0 < iVar6) {
      iVar8 = item->index;
      this->list[iVar8] = pGVar3;
      iVar7 = pGVar3->index;
      this->list[iVar7] = item;
      iVar8 = iVar8 + iVar7;
      item->index = iVar8;
      iVar8 = iVar8 - pGVar3->index;
      pGVar3->index = iVar8;
      iVar8 = item->index - iVar8;
      iVar4 = (iVar8 - (iVar8 + -1 >> 0x1f)) + -1 >> 1;
      iVar7 = 0;
      if (0 < iVar4) {
        iVar7 = iVar4;
      }
      item->index = iVar8;
      if (iVar2 <= iVar4) {
        iVar7 = iVar2 + -1;
      }
    }
  } while (0 < iVar6);
  return;
}

Assistant:

void sort_up(GridNode *item)
    {
        int parentIndex = clamp((item->index - 1) / 2, 0, maxCount - 1);
        while (true)
        {
            GridNode *parent = list[parentIndex];
            if (item->compare_item(parent) > 0)
            {
                swap_items(item, parent);
            }
            else
            {
                break;
            }
            parentIndex = clamp((item->index - 1) / 2, 0, maxCount - 1);
        }
    }